

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# text.cpp
# Opt level: O2

string * format(string *__return_storage_ptr__,string *fmt,int arg1,double arg2)

{
  allocator<char> local_a2;
  allocator<char> local_a1;
  double local_a0;
  string local_98;
  string local_78;
  string local_58;
  string local_38;
  
  local_a0 = arg2;
  std::__cxx11::string::string((string *)__return_storage_ptr__,(string *)fmt);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_78,"{1}",(allocator<char> *)&local_58);
  format_abi_cxx11_(&local_98,arg1);
  replace_positional(__return_storage_ptr__,&local_78,&local_98);
  std::__cxx11::string::~string((string *)&local_98);
  std::__cxx11::string::~string((string *)&local_78);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_78,"{2}",&local_a1);
  format_abi_cxx11_(&local_58,local_a0,6,3);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_38," ",&local_a2);
  trim(&local_98,&local_58,&local_38);
  replace_positional(__return_storage_ptr__,&local_78,&local_98);
  std::__cxx11::string::~string((string *)&local_98);
  std::__cxx11::string::~string((string *)&local_38);
  std::__cxx11::string::~string((string *)&local_58);
  std::__cxx11::string::~string((string *)&local_78);
  return __return_storage_ptr__;
}

Assistant:

const std::string format (
  const std::string& fmt,
  int arg1,
  double arg2)
{
  std::string output = fmt;
  replace_positional (output, "{1}", format (arg1));
  replace_positional (output, "{2}", trim (format (arg2, 6, 3)));
  return output;
}